

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

void prscode(prscxdef *ctx,int markcomp)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  mcmon *nump;
  uchar *puVar10;
  uchar *puVar11;
  long lVar12;
  size_t sVar13;
  int in_ESI;
  undefined8 *in_RDI;
  int typ;
  errdef fr_;
  lindef *lin_1;
  lindef *lin;
  ushort objsiz;
  int len;
  char newnam [40];
  uchar *oldptr;
  uchar *newptr;
  mcmon newobj;
  int modflag;
  int oldflg;
  toktldef *ltab;
  uint curfr;
  int varargs;
  toktdef *oldltab;
  int classflg;
  objnum *scp;
  objnum sc [64];
  int numsc;
  uint oldslcl;
  uchar *oldplcl;
  int parms;
  tokdef tok;
  int t;
  errdef *in_stack_fffffffffffffcc8;
  mcmon bytes;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 uVar14;
  undefined2 in_stack_fffffffffffffcd4;
  mcmon in_stack_fffffffffffffcd6;
  tokdef *in_stack_fffffffffffffcd8;
  prscxdef *in_stack_fffffffffffffce0;
  tokdef *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  uint in_stack_fffffffffffffcf4;
  undefined8 in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  int modflag_00;
  undefined4 in_stack_fffffffffffffd10;
  undefined2 in_stack_fffffffffffffd14;
  ushort in_stack_fffffffffffffd16;
  mcmcxdef *in_stack_fffffffffffffd18;
  undefined8 uVar15;
  int in_stack_fffffffffffffd28;
  objnum in_stack_fffffffffffffd2e;
  prscxdef *in_stack_fffffffffffffd30;
  tokcxdef *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb4;
  int *in_stack_fffffffffffffdb8;
  prsndef **in_stack_fffffffffffffdc0;
  toktldef *in_stack_fffffffffffffdc8;
  prscxdef *in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffde0;
  long local_1b0;
  long local_1a8;
  uint local_19c;
  char local_198 [4];
  ushort in_stack_fffffffffffffe6c;
  mcmon in_stack_fffffffffffffe6e;
  mcmcxdef *in_stack_fffffffffffffe70;
  ushort local_15a;
  int local_158;
  toktldef *local_150;
  undefined2 *local_130;
  undefined2 local_128 [42];
  uint in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  prscxdef *in_stack_ffffffffffffff40;
  prscsdef *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  int local_a0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  modflag_00 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  local_a0 = 0;
  local_158 = 0;
  iVar9 = *(int *)(in_RDI[1] + 0x120);
  if (iVar9 == 1) {
    return;
  }
  local_10 = iVar9;
  if (iVar9 == 0x3e) {
    toknext(in_stack_fffffffffffffd88);
    return;
  }
  if (iVar9 == 0x57) {
    prscmpd(in_stack_fffffffffffffd30);
    return;
  }
  if (iVar9 != 0x5b) {
    local_c = in_ESI;
    local_8 = in_RDI;
    if ((iVar9 == 0xce) || (iVar9 == 0xcf)) {
      local_10 = toknext(in_stack_fffffffffffffd88);
      local_158 = iVar9;
    }
    if (local_10 == 0xcd) {
      prsspec((prscxdef *)
              CONCAT26(in_stack_fffffffffffffd16,
                       CONCAT24(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)),modflag_00);
      return;
    }
    if (local_10 == 0x50) {
      local_10 = toknext(in_stack_fffffffffffffd88);
    }
    if (local_10 != 0x38) {
      errsigf((errcxdef *)
              CONCAT26(in_stack_fffffffffffffcd6,
                       CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
              (char *)in_stack_fffffffffffffcc8,0);
    }
    lVar12 = local_8[1];
    nump = (mcmon *)(lVar12 + 0x120);
    local_28 = *(undefined8 *)(lVar12 + 0x180);
    uStack_20 = *(undefined8 *)(lVar12 + 0x188);
    local_38 = *(undefined8 *)(lVar12 + 0x170);
    uStack_30 = *(undefined8 *)(lVar12 + 0x178);
    local_48 = *(ulong *)(lVar12 + 0x160);
    uStack_40 = *(undefined8 *)(lVar12 + 0x168);
    if (local_158 == 0xcf) {
      if (((char)local_48 != '\x02') ||
         (local_48._2_2_ = (ushort)(local_48 >> 0x10),
         *(long *)(*(long *)(local_8[6] + 0x58 + (long)((int)(uint)local_48._2_2_ >> 8) * 8) +
                  (long)(int)(local_48._2_2_ & 0xff) * 8) == 0)) {
        errsigf((errcxdef *)
                CONCAT26(in_stack_fffffffffffffcd6,
                         CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                (char *)in_stack_fffffffffffffcc8,0);
      }
      uVar1 = *(ushort *)
               (*(long *)(**(long **)local_8[4] +
                         (long)((int)(uint)*(ushort *)
                                            (*(long *)(local_8[4] + 0x30 +
                                                      (long)((int)(uint)local_48._2_2_ >> 8) * 8) +
                                            (long)(int)(local_48._2_2_ & 0xff) * 2) >> 8) * 8) +
                (long)(int)(*(ushort *)
                             (*(long *)(local_8[4] + 0x30 +
                                       (long)((int)(uint)local_48._2_2_ >> 8) * 8) +
                             (long)(int)(local_48._2_2_ & 0xff) * 2) & 0xff) * 0x20 + 0x18);
      puVar10 = mcmalo0(in_stack_fffffffffffffd18,in_stack_fffffffffffffd16,nump,
                        (mcmon)((ulong)in_stack_fffffffffffffd00 >> 0x30),
                        (int)in_stack_fffffffffffffd00);
      uVar14 = (undefined4)((ulong)nump >> 0x20);
      puVar11 = mcmlck((mcmcxdef *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd6);
      memcpy(puVar10,puVar11,(ulong)uVar1);
      osrp2(puVar10 + 2);
      puVar11 = puVar10 + 2;
      uVar7 = osrp2(puVar10 + 2);
      oswp2(puVar11,uVar7 & 0xffff | 5);
      lVar12 = *(long *)(**(long **)local_8[4] +
                        (long)((int)(uint)*(ushort *)
                                           (*(long *)(local_8[4] + 0x30 +
                                                     (long)((int)(uint)local_15a >> 8) * 8) +
                                           (long)(int)(local_15a & 0xff) * 2) >> 8) * 8) +
               (long)(int)(*(ushort *)
                            (*(long *)(local_8[4] + 0x30 + (long)((int)(uint)local_15a >> 8) * 8) +
                            (long)(int)(local_15a & 0xff) * 2) & 0xff) * 0x20;
      *(ushort *)(lVar12 + 0x14) = *(ushort *)(lVar12 + 0x14) | 1;
      mcmunlck((mcmcxdef *)
               CONCAT26(in_stack_fffffffffffffcd6,
                        CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
               (mcmon)((ulong)in_stack_fffffffffffffcc8 >> 0x30));
      mcmunlck((mcmcxdef *)
               CONCAT26(in_stack_fffffffffffffcd6,
                        CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
               (mcmon)((ulong)in_stack_fffffffffffffcc8 >> 0x30));
      local_19c = (uint)local_48._6_1_;
      if (0x22 < local_19c) {
        local_19c = 0x22;
      }
      sprintf(local_198,"%.*s@%d",(ulong)local_19c,(long)&local_48 + 7,(ulong)local_15a);
      pcVar4 = *(code **)local_8[2];
      in_stack_fffffffffffffce0 = (prscxdef *)local_8[2];
      in_stack_fffffffffffffce8 = (tokdef *)local_198;
      sVar13 = strlen(local_198);
      in_stack_fffffffffffffcf0 = (undefined4)sVar13;
      in_stack_fffffffffffffcf4 = (uint)local_15a;
      uVar8 = tokhsh(local_198);
      (*pcVar4)(in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0,2,
                in_stack_fffffffffffffcf4,uVar8);
      vociren((voccxdef *)
              CONCAT26(in_stack_fffffffffffffd16,
                       CONCAT24(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)),
              (objnum)((uint)uVar14 >> 0x10),(objnum)uVar14);
      for (local_1a8 = *(long *)(*(long *)(*(long *)(local_8[6] + 0x10) + 0x68) + 0x20);
          local_1a8 != 0; local_1a8 = *(long *)(local_1a8 + 0xb0)) {
        (**(code **)(local_1a8 + 0x90))(local_1a8,local_48._2_2_,local_15a,local_48._2_2_);
      }
      toknext(in_stack_fffffffffffffd88);
    }
    else {
      prsnreq((prscxdef *)
              CONCAT26(in_stack_fffffffffffffcd6,
                       CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
              (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      local_10 = *(int *)(local_8[1] + 0x120);
      in_stack_fffffffffffffcd8 = (tokdef *)(ulong)(local_10 - 0x38);
      switch(in_stack_fffffffffffffcd8) {
      case (tokdef *)0x0:
        local_130 = local_128;
        while( true ) {
          if (0x3f < local_a0) {
            errsigf((errcxdef *)
                    CONCAT26(in_stack_fffffffffffffcd6,
                             CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                    (char *)in_stack_fffffffffffffcc8,0);
          }
          prsdef((prscxdef *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffce8,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
          if ((*(char *)(local_8[1] + 0x160) != '\x02') && (*(char *)(local_8[1] + 0x160) != '\a'))
          {
            errsigf((errcxdef *)
                    CONCAT26(in_stack_fffffffffffffcd6,
                             CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                    (char *)in_stack_fffffffffffffcc8,0);
          }
          *local_130 = *(undefined2 *)(local_8[1] + 0x162);
          local_a0 = local_a0 + 1;
          iVar9 = toknext(in_stack_fffffffffffffd88);
          if (iVar9 != 0x3f) break;
          toknext(in_stack_fffffffffffffd88);
          local_130 = local_130 + 1;
        }
        break;
      default:
        errsigf((errcxdef *)
                CONCAT26(in_stack_fffffffffffffcd6,
                         CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                (char *)in_stack_fffffffffffffcc8,0);
      case (tokdef *)0xe:
        if (local_158 == 0xcf) {
          errlogf((errcxdef *)
                  CONCAT26(in_stack_fffffffffffffcd6,
                           CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                  (char *)in_stack_fffffffffffffcc8,0);
        }
        prsdef((prscxdef *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
        local_10 = toknext(in_stack_fffffffffffffd88);
        if (local_10 == 0x3e) {
          if (local_158 != 0) {
            errlogf((errcxdef *)
                    CONCAT26(in_stack_fffffffffffffcd6,
                             CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                    (char *)in_stack_fffffffffffffcc8,0);
          }
          if (((char)local_48 != '\b') && ((char)local_48 != '\x01')) {
            errsigf((errcxdef *)
                    CONCAT26(in_stack_fffffffffffffcd6,
                             CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                    (char *)in_stack_fffffffffffffcc8,0);
          }
          toknext(in_stack_fffffffffffffd88);
          return;
        }
        if (((char)local_48 != '\b') && (((char)local_48 != '\x01' || (local_158 != 0xce)))) {
          errlogf((errcxdef *)
                  CONCAT26(in_stack_fffffffffffffcd6,
                           CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                  (char *)in_stack_fffffffffffffcc8,0);
          local_48 = local_48 & 0xffffffffffffff00;
          (**(code **)(local_8[2] + 0x10))(local_8[2],&local_48);
          prsdef((prscxdef *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffce8,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
        }
        local_48 = CONCAT71(local_48._1_7_,1);
        (**(code **)(local_8[2] + 0x10))(local_8[2],&local_48);
        uVar5 = *(undefined8 *)(local_8[1] + 0x28);
        uVar6 = local_8[0x17];
        uVar2 = *(undefined2 *)(local_8 + 0x18);
        local_150 = (toktldef *)0x0;
        if (local_10 == 0x32) {
          in_stack_fffffffffffffcc8 =
               (errdef *)((ulong)in_stack_fffffffffffffcc8 & 0xffffffff00000000);
          local_150 = prsvlst(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                              in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                              in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8,
                              in_stack_fffffffffffffde0);
          prsreq((prscxdef *)
                 CONCAT26(in_stack_fffffffffffffcd6,
                          CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        }
        if (local_158 == 0xce) {
          for (local_1b0 = *(long *)(*(long *)(*(long *)(local_8[6] + 0x10) + 0x68) + 0x20);
              local_1b0 != 0; local_1b0 = *(long *)(local_1b0 + 0xb0)) {
            (**(code **)(local_1b0 + 0x98))(local_1b0,local_48._2_2_);
          }
        }
        puVar10 = mcmlck((mcmcxdef *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd6);
        *(uchar **)(local_8[5] + 0x18) = puVar10;
        *(undefined2 *)(local_8[5] + 0x12) = 0;
        *(ushort *)(local_8[5] + 0x10) = local_48._2_2_;
        uVar3 = *(undefined2 *)(local_8 + 0x10);
        *(ushort *)(local_8 + 0x10) = *(ushort *)(local_8 + 0x10) | 0x40;
        iVar9 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffd88);
        if (iVar9 == 0) {
          uVar15 = *(undefined8 *)*local_8;
          *(undefined1 **)*local_8 = &stack0xfffffffffffffd18;
          if ((*(ushort *)(local_8 + 0x10) & 8) != 0) {
            emtres((emtcxdef *)
                   CONCAT26(in_stack_fffffffffffffcd6,
                            CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                   (ushort)((ulong)in_stack_fffffffffffffcc8 >> 0x30));
            lVar12 = *(long *)(local_8[5] + 0x18);
            uVar1 = *(ushort *)(local_8[5] + 0x12);
            *(ushort *)(local_8[5] + 0x12) = uVar1 + 1;
            *(undefined1 *)(lVar12 + (int)(uint)uVar1) = 0x4d;
            emtres((emtcxdef *)
                   CONCAT26(in_stack_fffffffffffffcd6,
                            CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                   (ushort)((ulong)in_stack_fffffffffffffcc8 >> 0x30));
            lVar12 = *(long *)(local_8[5] + 0x18);
            uVar1 = *(ushort *)(local_8[5] + 0x12);
            *(ushort *)(local_8[5] + 0x12) = uVar1 + 1;
            *(undefined1 *)(lVar12 + (int)(uint)uVar1) = 0;
          }
          iVar9 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
          if (local_150 != (toktldef *)0x0) {
            prsvgfr(in_stack_fffffffffffffce0,(toktldef *)in_stack_fffffffffffffcd8,
                    (uint *)CONCAT26(in_stack_fffffffffffffcd6,
                                     CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)))
            ;
          }
          if (*(int *)(local_8[1] + 0x120) != 0x3c) {
            prssigreq((prscxdef *)
                      CONCAT26(in_stack_fffffffffffffcd6,
                               CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),iVar9)
            ;
          }
          bytes = 0;
          uVar14 = 0;
          prsstm(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
          emtres((emtcxdef *)
                 CONCAT26(in_stack_fffffffffffffcd6,CONCAT24(in_stack_fffffffffffffcd4,uVar14)),
                 bytes);
          lVar12 = *(long *)(local_8[5] + 0x18);
          uVar1 = *(ushort *)(local_8[5] + 0x12);
          *(ushort *)(local_8[5] + 0x12) = uVar1 + 1;
          *(undefined1 *)(lVar12 + (int)(uint)uVar1) = 0x16;
          emtres((emtcxdef *)
                 CONCAT26(in_stack_fffffffffffffcd6,CONCAT24(in_stack_fffffffffffffcd4,uVar14)),
                 bytes);
          oswp2((void *)(*(long *)(local_8[5] + 0x18) +
                        (long)(int)(uint)*(ushort *)(local_8[5] + 0x12)),0);
          *(short *)(local_8[5] + 0x12) = *(short *)(local_8[5] + 0x12) + 2;
          local_8[0x17] = uVar6;
          *(undefined2 *)(local_8 + 0x18) = uVar2;
          mcmrealo(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6e,in_stack_fffffffffffffe6c);
          lVar12 = *(long *)(**(long **)local_8[4] +
                            (long)((int)(uint)*(ushort *)
                                               (*(long *)(local_8[4] + 0x30 +
                                                         (long)((int)(uint)local_48._2_2_ >> 8) * 8)
                                               + (long)(int)(local_48._2_2_ & 0xff) * 2) >> 8) * 8)
                   + (long)(int)(*(ushort *)
                                  (*(long *)(local_8[4] + 0x30 +
                                            (long)((int)(uint)local_48._2_2_ >> 8) * 8) +
                                  (long)(int)(local_48._2_2_ & 0xff) * 2) & 0xff) * 0x20;
          *(ushort *)(lVar12 + 0x14) = *(ushort *)(lVar12 + 0x14) | 1;
          mcmunlck((mcmcxdef *)
                   CONCAT26(in_stack_fffffffffffffcd6,CONCAT24(in_stack_fffffffffffffcd4,uVar14)),
                   bytes);
          *(undefined8 *)(local_8[5] + 0x18) = 0;
          *(undefined8 *)(local_8[1] + 0x28) = uVar5;
          *(undefined2 *)(local_8 + 0x10) = uVar3;
          prsdelgoto((prscxdef *)
                     CONCAT26(in_stack_fffffffffffffcd6,CONCAT24(in_stack_fffffffffffffcd4,uVar14)))
          ;
          *(undefined8 *)*local_8 = uVar15;
          return;
        }
        *(mcmcxdef **)*local_8 = in_stack_fffffffffffffd18;
        local_8[0x17] = uVar6;
        *(undefined2 *)(local_8 + 0x18) = uVar2;
        *(undefined8 *)(local_8[1] + 0x28) = uVar5;
        *(undefined2 *)(local_8 + 0x10) = uVar3;
        prsdelgoto((prscxdef *)
                   CONCAT26(in_stack_fffffffffffffcd6,
                            CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)));
        mcmunlck((mcmcxdef *)
                 CONCAT26(in_stack_fffffffffffffcd6,
                          CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                 (mcmon)((ulong)in_stack_fffffffffffffcc8 >> 0x30));
        errrse1((errcxdef *)
                CONCAT26(in_stack_fffffffffffffcd6,
                         CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                in_stack_fffffffffffffcc8);
      case (tokdef *)0x11:
        toknext(in_stack_fffffffffffffd88);
        break;
      case (tokdef *)0x22:
        if (local_158 != 0) {
          errlogf((errcxdef *)
                  CONCAT26(in_stack_fffffffffffffcd6,
                           CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                  (char *)in_stack_fffffffffffffcc8,0);
        }
        iVar9 = (int)((ulong)in_stack_fffffffffffffce0 >> 0x20);
        prsnreq((prscxdef *)
                CONCAT26(in_stack_fffffffffffffcd6,
                         CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        prsreq((prscxdef *)
               CONCAT26(in_stack_fffffffffffffcd6,
                        CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        prsdef((prscxdef *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8,iVar9);
        if ((char)local_48 == '\n') {
          return;
        }
        errsigf((errcxdef *)
                CONCAT26(in_stack_fffffffffffffcd6,
                         CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
                (char *)in_stack_fffffffffffffcc8,0);
      }
    }
    prsdef((prscxdef *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
           in_stack_fffffffffffffce8,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    if (((char)local_48 != '\a') && (((char)local_48 != '\x02' || (local_158 == 0)))) {
      errlogf((errcxdef *)
              CONCAT26(in_stack_fffffffffffffcd6,
                       CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
              (char *)in_stack_fffffffffffffcc8,0);
      local_48 = local_48 & 0xffffffffffffff00;
      prsdefobj(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                CONCAT22(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd4));
    }
    iVar9 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    if ((local_158 == 0xce) && ((char)local_48 == '\x02')) {
      vocidel((voccxdef *)local_8[6],local_48._2_2_);
      vocdel((voccxdef *)
             CONCAT26(in_stack_fffffffffffffcd6,
                      CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),
             (objnum)((uint)iVar9 >> 0x10));
    }
    local_48 = CONCAT71(local_48._1_7_,2);
    (**(code **)(local_8[2] + 0x10))(local_8[2],&local_48);
    prsobj((prscxdef *)sc._112_8_,(tokdef *)sc._104_8_,sc._100_4_,(objnum *)sc._88_8_,sc._84_4_);
    if (local_c != 0) {
      objcomp((mcmcxdef *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2e,
              in_stack_fffffffffffffd28);
    }
    prsreq((prscxdef *)
           CONCAT26(in_stack_fffffffffffffcd6,
                    CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)),iVar9);
    return;
  }
  prsfmt((prscxdef *)
         CONCAT26(in_stack_fffffffffffffd16,
                  CONCAT24(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)));
  return;
}

Assistant:

void prscode(prscxdef *ctx, int markcomp)
{
    int           t;
    noreg tokdef  tok;
    int           parms;
    uchar        *oldplcl;
    uint          oldslcl;
    int           numsc = 0;           /* number of superclasses for object */
    objnum        sc[PRSMAXSC];           /* superclasses of current object */
    objnum       *scp;
    int           classflg = 0;  /* VOCIFCLASS ==> object is a class object */
    toktdef      *oldltab;
    int           varargs;
    uint          curfr;
    toktldef     *ltab;
    int           oldflg;
    int           modflag = 0;                      /* modify/replace flags */
    
    NOREG((&tok))
    
    t = ctx->prscxtok->tokcxcur.toktyp;
    if (t == TOKTEOF) return;            /* end of file; nothing more to do */
    
    /* allow null statements */
    if (t == TOKTSEM)
    {
        toknext(ctx->prscxtok);
        return;
    }

    /* check for special "compound word" construction */
    if (t == TOKTCOMPOUND)
    {
        prscmpd(ctx);
        return;
    }
    
    /* check for special formatString construct */
    if (t == TOKTFORMAT)
    {
        prsfmt(ctx);
        return;
    }
    
    /* check for 'replace' or 'modify' keywords */
    if (t == TOKTREPLACE || t == TOKTMODIFY)
    {
        modflag = t;
        t = toknext(ctx->prscxtok);
    }

    /* check for specialWords construct */
    if (t == TOKTSPECIAL)
    {
        prsspec(ctx, modflag);
        return;
    }

    /* check for 'class' prefix */
    if (t == TOKTCLASS)
    {
        classflg = VOCIFCLASS;
        t = toknext(ctx->prscxtok);
    }

    if (t != TOKTSYMBOL) errsig(ctx->prscxerr, ERR_REQSYM);
    OSCPYSTRUCT(tok, ctx->prscxtok->tokcxcur);

    /* 'modify <object>' skips the colon and goes directly to the body */
    if (modflag == TOKTMODIFY)
    {
        mcmon   newobj;
        uchar  *newptr;
        uchar  *oldptr;
        char    newnam[TOKNAMMAX+1];
        int     len;
        ushort  objsiz;
        lindef *lin;
        
        /* require a previously defined object */
        if (tok.toksym.tokstyp != TOKSTOBJ
            || vocinh(ctx->prscxvoc, tok.toksym.toksval) == 0)
            errsig(ctx->prscxerr, ERR_MODOBJ);

        /* create a copy of the original object */
        objsiz = mcmobjsiz(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        newptr = mcmalo(ctx->prscxmem, objsiz, &newobj);
        oldptr = mcmlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        memcpy(newptr, oldptr, (size_t)objsiz);

        /* remember whether the original object was a class */
        if (objflg(newptr) & OBJFCLASS)
            classflg = VOCIFCLASS;

        /*
         *   Set the "superseded by modified object" flag in the
         *   original.  Also set the class flag, because we want the
         *   modified version to inherit location and vocabulary. 
         */
        objsflg(newptr, objflg(newptr) | OBJFMOD | OBJFCLASS);
        mcmtch(ctx->prscxmem, (mcmon)newobj);

        /* done with the objects - unlock them */
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, newobj);

        /* create a fake symbol table entry for the original data */
        len = tok.toksym.tokslen;
        if (len > TOKNAMMAX - 5) len = TOKNAMMAX - 5;
        sprintf(newnam, "%.*s@%d", len, tok.toksym.toksnam,
                (int)newobj);
        (*ctx->prscxstab->toktfadd)(ctx->prscxstab, newnam,
                                    (int)strlen(newnam), TOKSTOBJ,
                                    (int)newobj, tokhsh(newnam));

        /* the superclass for the new object is simply the old object */
        numsc = 1;
        sc[0] = newobj;

        /* renumber the inheritance records for the old object */
        vociren(ctx->prscxvoc, tok.toksym.toksval, newobj);

        /* go through all line sources and renumber this object */
        for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
             lin = lin->linnxt)
        {
            /* renumber instances of the object in this line source */
            linrenum(lin, tok.toksym.toksval, newobj);
        }

        /* go parse the object body as normal */
        toknext(ctx->prscxtok);
        goto objbody;
    }
    
    prsnreq(ctx, TOKTCOLON);
    t = ctx->prscxtok->tokcxcur.toktyp;
    switch(t)
    {
    case TOKTEXTERN:
        if (modflag) errlog(ctx->prscxerr, ERR_MODRPLX);
        prsnreq(ctx, TOKTFUNCTION);
        prsreq(ctx, TOKTSEM);
        prsdef(ctx, (tokdef *)&tok, TOKSTEXTERN);
        if (tok.toksym.tokstyp != TOKSTEXTERN)
            errsig(ctx->prscxerr, ERR_REQEXT);
        break;
        
    case TOKTFUNCTION:
        if (modflag == TOKTMODIFY) errlog(ctx->prscxerr, ERR_MODFCN);
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        t = toknext(ctx->prscxtok);
        if (t == TOKTSEM)
        {
            if (modflag) errlog(ctx->prscxerr, ERR_MODFWD);
            if (tok.toksym.tokstyp != TOKSTFWDFN &&
                tok.toksym.tokstyp != TOKSTFUNC)
                errsig(ctx->prscxerr, ERR_REQFCN);
            toknext(ctx->prscxtok);
            break;
        }

        /* check that we're not redefining the symbol, then define as fcn */
        if (!(tok.toksym.tokstyp == TOKSTFWDFN
              || (tok.toksym.tokstyp == TOKSTFUNC && modflag == TOKTREPLACE)))
        {
            /* log the error */
            errlog(ctx->prscxerr, ERR_FREDEF);

            /* 
             *   Since the symbol was already defined as something else,
             *   we haven't given it a proper function definition yet.  In
             *   particular, we haven't assigned an object number to the
             *   function.  Do so now by forcing the symbol to undefined
             *   then defining it as a function again.
             *   
             *   Note that we need to force the change in the global
             *   symbol table itself.  This will hose down any previous
             *   definition of the symbol, but this doesn't matter much
             *   since the game is already not playable due to this error.
             */

            /* set it to unknown */
            tok.toksym.tokstyp = TOKSTUNK;

            /* force it back into the global table as unknown */
            (*ctx->prscxstab->toktfset)(ctx->prscxstab,
                                        (toksdef *)&tok.toksym);

            /* define it as a forward function to assign an object ID */
            prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        }

        /* 
         *   make sure the symbol is in the symbol table as a function if
         *   it's not already - it could have been a forward function, in
         *   which case it's time to make it a defined function, since
         *   this is the definition 
         */
        tok.toksym.tokstyp = TOKSTFUNC;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);
        
        oldltab = ctx->prscxtok->tokcxstab;           /* remember old table */
        oldplcl = ctx->prscxplcl;                /* and old table pool data */
        oldslcl = ctx->prscxslcl;

        varargs = FALSE;
        parms = 0;
        curfr = 0;                                /* no enclosing frame yet */
        ltab = (toktldef *)0;                  /* no local symbol table yet */
        if (t == TOKTLPAR)
        {
            ltab = prsvlst(ctx, (toktldef *)0, (prsndef **)0, &parms, TRUE,
                           &varargs, curfr);
            prsreq(ctx, TOKTRPAR);
        }
        
        /*
         *   If we're replacing this function, delete any references in
         *   line number records to this object; this will prevent the
         *   debugger from attempting to use these records, which will be
         *   invalid after we replace the object's pcode with the new
         *   pcode here.  
         */
        if (modflag == TOKTREPLACE)
        {
            lindef *lin;
            for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
                 lin = lin->linnxt)
            {
                /* delete instances of the object in this line source */
                lindelnum(lin, (objnum)tok.toksym.toksval);
            }
        }

        /* set up emit context for the new object */
        ctx->prscxemt->emtcxptr = mcmlck(ctx->prscxmem,
                                         (mcmon)tok.toksym.toksval);
        ctx->prscxemt->emtcxofs = 0;
        ctx->prscxemt->emtcxobj = tok.toksym.toksval;

        /* flag that we're doing a function - no "self" */
        oldflg = ctx->prscxflg;
        ctx->prscxflg |= PRSCXFFUNC;
        
        /* now parse the body of the function */
        ERRBEGIN(ctx->prscxerr)
            
        if (ctx->prscxflg & PRSCXFARC)
        {
            emtop(ctx->prscxemt, OPCCHKARGC);
            emtbyte(ctx->prscxemt, (varargs ? 0x80 : 0 ) + parms);
        }
        
        /* if there's a local symbol table, set up debug record */
        if (ltab) prsvgfr(ctx, ltab, &curfr);
        
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTLBRACE)
            prssigreq(ctx, TOKTLBRACE);
        prsstm(ctx, EMTLLNKEND, EMTLLNKEND, parms, 0, 0, (prscsdef *)0,
               curfr);
        
        /* be sure to emit a 'return' at the end of the function */
        emtop(ctx->prscxemt, OPCRETURN);
        emtint2(ctx->prscxemt, 0);
        
        /* restore local symbol table information in context */
        ctx->prscxplcl = oldplcl;
        ctx->prscxslcl = oldslcl;
        
        /* resize the object down to the actual space needed */
        mcmrealo(ctx->prscxmem, (mcmon)tok.toksym.toksval,
                 (ushort)ctx->prscxemt->emtcxofs);
        
        /* tell cache manager the object's been changed, and unlock it */
        mcmtch(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);

        /* to prevent stray writes to this object... */
        ctx->prscxemt->emtcxptr = (uchar *)0;
        
        /* clean up context changes, and delete labels */
        ctx->prscxtok->tokcxstab = oldltab;
        ctx->prscxflg = oldflg;
        prsdelgoto(ctx);

        ERRCLEAN(ctx->prscxerr)
            ctx->prscxplcl = oldplcl;
            ctx->prscxslcl = oldslcl;
            ctx->prscxtok->tokcxstab = oldltab;
            ctx->prscxflg = oldflg;
            prsdelgoto(ctx);
            mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        ERRENDCLN(ctx->prscxerr)
        
        break;  
        
    case TOKTSYMBOL:
        for (scp = sc ;;)
        {
            int typ;
            
            /* check that we have room for a new superclass */
            if (numsc >= PRSMAXSC) errsig(ctx->prscxerr, ERR_MANYSC);

            /* define superclass symbol as object if not already done */
            prsdef(ctx, &ctx->prscxtok->tokcxcur, TOKSTFWDOBJ);
            typ = ctx->prscxtok->tokcxcur.toksym.tokstyp;
            if (typ != TOKSTOBJ && typ != TOKSTFWDOBJ)
                errsig(ctx->prscxerr, ERR_REQOBJ);
            
            /* add the object to the superclass array */
            *scp++ = ctx->prscxtok->tokcxcur.toksym.toksval;
            ++numsc;
            
            /* skip the token, and keep going as long as the list continues */
            if (toknext(ctx->prscxtok) != TOKTCOMMA) break;
            typ = toknext(ctx->prscxtok);        /* get next object in list */
        }
        goto objbody;
        /* FALLTHROUGH */
        
    case TOKTOBJECT:
        toknext(ctx->prscxtok);
    objbody:
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        if (!(tok.toksym.tokstyp == TOKSTFWDOBJ
              || (tok.toksym.tokstyp == TOKSTOBJ && modflag != 0)))
        {
            /* 
             *   it's already defined globally as something other than an
             *   object - log an error 
             */
            errlog(ctx->prscxerr, ERR_OREDEF);

            /* 
             *   actually redefine the symbol as an object, so that we can
             *   proceed with the compilation 
             */
            tok.toksym.tokstyp = TOKSTUNK;
            prsdefobj(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        }

        /* if we're replacing the object, delete its vocabulary records */
        if (modflag == TOKTREPLACE && tok.toksym.tokstyp == TOKSTOBJ)
        {
            vocidel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
            vocdel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
        }

        /* make the symbol refer to an object now */
        tok.toksym.tokstyp = TOKSTOBJ;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);

        /* compile the object */
        prsobj(ctx, &tok, numsc, sc, classflg);
        if (markcomp)
            objcomp(ctx->prscxmem, (objnum)tok.toksym.toksval,
                    (ctx->prscxflg & PRSCXFLIN) != 0);
        
        prsreq(ctx, TOKTSEM);
        break;
        
    default:
        errsig(ctx->prscxerr, ERR_SYNTAX);
    }
}